

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

uint32 __thiscall
Protocol::MQTT::V5::PropertiesView::readFrom(PropertiesView *this,uint8 *_buffer,uint32 bufLength)

{
  VBInt *this_00;
  uint32 uVar1;
  uint32 uVar2;
  
  this_00 = &this->length;
  uVar1 = Common::VBInt::readFrom(this_00,_buffer,bufLength);
  if (uVar1 < 0xfffffffd) {
    uVar2 = Common::VBInt::operator_cast_to_unsigned_int(this_00);
    if (bufLength - (this->length).size < uVar2) {
      uVar1 = 0xfffffffe;
    }
    else {
      this->buffer = _buffer + uVar1;
      uVar2 = Common::VBInt::operator_cast_to_unsigned_int(this_00);
      uVar1 = uVar1 + uVar2;
    }
  }
  return uVar1;
}

Assistant:

uint32 readFrom(const uint8 * _buffer, uint32 bufLength)
                {
                    uint32 o = length.readFrom(_buffer, bufLength);
                    if (isError(o)) return o;
                    if ((uint32)length > bufLength - length.getSize()) return NotEnoughData;
                    buffer = _buffer + o;
                    return o + (uint32)length;
                }